

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O3

int baryonyx::itm::
    compute_violated_constraints<baryonyx::itm::solver_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,false>,baryonyx::bit_array>
              (solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>
               *slv,bit_array *x,vector<int,_std::allocator<int>_> *out)

{
  iterator __position;
  bool bVar1;
  pointer piVar2;
  pointer piVar3;
  int local_24;
  
  piVar2 = (out->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((out->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
      != piVar2) {
    (out->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
         piVar2;
  }
  local_24 = 0;
  piVar3 = piVar2;
  if (slv->m != 0) {
    do {
      bVar1 = is_valid_constraint<baryonyx::itm::solver_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<double>,false>,baryonyx::bit_array>
                        (slv,local_24,x);
      if (!bVar1) {
        __position._M_current =
             (out->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
        if (__position._M_current ==
            (out->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int&>
                    ((vector<int,std::allocator<int>> *)out,__position,&local_24);
        }
        else {
          *__position._M_current = local_24;
          (out->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_finish = __position._M_current + 1;
        }
      }
      local_24 = local_24 + 1;
    } while (local_24 != slv->m);
    piVar3 = (out->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    piVar2 = (out->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
  }
  return (int)((ulong)((long)piVar2 - (long)piVar3) >> 2);
}

Assistant:

int
compute_violated_constraints(const Solver& slv,
                             const Xtype& x,
                             std::vector<int>& out)
{
    out.clear();

    for (int k = 0; k != slv.m; ++k)
        if (!is_valid_constraint(slv, k, x))
            out.emplace_back(k);

    return length(out);
}